

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::DynamicMapField::DynamicMapField
          (DynamicMapField *this,Message *default_entry,Message *mapped_default_entry_if_message,
          Arena *arena)

{
  TypeKind key_type;
  TypeKind value_type;
  TypeInfo TVar1;
  FieldDescriptor *pFVar2;
  Metadata MVar3;
  
  MapFieldBaseForParse::MapFieldBaseForParse
            ((MapFieldBaseForParse *)this,default_entry,(TaggedPtr)arena);
  MVar3 = Message::GetMetadata(default_entry);
  pFVar2 = Descriptor::map_key(MVar3.descriptor);
  key_type = CppTypeToTypeKind(*(CppType *)
                                (FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar2->type_ * 4));
  pFVar2 = Descriptor::map_value(MVar3.descriptor);
  value_type = CppTypeToTypeKind(*(CppType *)
                                  (FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar2->type_ * 4));
  TVar1 = UntypedMapBase::GetTypeInfoDynamic
                    (key_type,value_type,&mapped_default_entry_if_message->super_MessageLite);
  (this->map_).num_elements_ = 0;
  (this->map_).num_buckets_ = 1;
  (this->map_).index_of_first_non_null_ = 1;
  (this->map_).type_info_ = TVar1;
  (this->map_).table_ = (NodeBase **)&kGlobalEmptyTable;
  (this->map_).arena_ = arena;
  return;
}

Assistant:

DynamicMapField::DynamicMapField(const Message* default_entry,
                                 const Message* mapped_default_entry_if_message,
                                 Arena* arena)
    : MapFieldBase(default_entry, arena),
      map_(arena, DefaultEntryToTypeInfo(default_entry,
                                         mapped_default_entry_if_message)) {
  // This invariant is required by `GetMapRaw` to easily access the map
  // member without paying for dynamic dispatch.
  static_assert(MapFieldBaseForParse::MapOffset() ==
                PROTOBUF_FIELD_OFFSET(DynamicMapField, map_));
}